

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O3

QString * rawWeekDayName(QString *__return_storage_ptr__,QLocaleData *data,int day,FormatType type)

{
  QString *pQVar1;
  ulong uVar2;
  ulong uVar3;
  long in_FS_OFFSET;
  DataRange local_10;
  QString *local_8;
  
  local_8 = *(QString **)(in_FS_OFFSET + 0x28);
  if (type == NarrowFormat) {
    uVar2 = (ulong)data->m_narrowDayNames_idx;
    uVar3 = (ulong)data->m_narrowDayNames_size;
  }
  else if (type == ShortFormat) {
    uVar2 = (ulong)data->m_shortDayNames_idx;
    uVar3 = (ulong)data->m_shortDayNames_size;
  }
  else {
    if (type != LongFormat) {
      pQVar1 = *(QString **)(in_FS_OFFSET + 0x28);
      if (pQVar1 == local_8) {
        (__return_storage_ptr__->d).d = (Data *)0x0;
        (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
        (__return_storage_ptr__->d).size = 0;
        return pQVar1;
      }
      goto LAB_0030eaaf;
    }
    uVar2 = (ulong)data->m_longDayNames_idx;
    uVar3 = (ulong)data->m_longDayNames_size;
  }
  local_10 = (DataRange)(uVar3 << 0x20 | uVar2);
  uVar2 = 0;
  if (day != 7) {
    uVar2 = (ulong)(uint)day;
  }
  QLocaleData::DataRange::getListEntry
            (__return_storage_ptr__,&local_10,
             L"Sunday;Monday;Tuesday;Wednesday;Thursday;Friday;SaturdaySun;Mon;Tue;Wed;Thu;Fri;SatS;M;T;W;T;F;S7;1;2;3;4;5;6Амҽыша;Ашәахьа;Аҩаша;Ахаша;Аԥшьаша;Ахәаша;АсабшаАм;Ашә;Аҩ;Ах;Аԥ;Ахә;АсМ;Шә;Ҩ;Х;Ԥ;Хә;СAcaada;Etleeni;Talaata;Arbaqa;Kamiisi;Gumqata;SabtiAca;Etl;Tal;Arb;Kam;Gum;SabA;E;T;A;K;G;SSondag;Maandag;Dinsdag;Woensdag;Donderdag;Vrydag;SaterdagSo.;Ma.;Di.;Wo.;Do.;Vr.;Sa.S;M;D;W;D;V;Stsuʔntsɨ;tsuʔukpà;tsuʔughɔe;tsuʔutɔ̀mlò;tsuʔumè;tsuʔughɨ̂m;tsuʔndzɨkɔʔɔnts;kpa;ghɔ;tɔm;ume;ghɨ;dzkn;k;g;t;u;g;dKwasiada;Dwoada;Benada;Wukuada;Yawoada;Fiada;MemenedaKwe;Dwo;Ben;Wuk;Yaw;Fia;MemK;D;B;W;Y;F;Me diel;e hënë;e martë;e mërkurë;e enjte;e premte;e shtunëdie;hën;mar;mër;enj;pre;shtd;h;m;m;e;p;shእሑድ;ሰኞ;ማክሰኞ;ረቡዕ;ሐሙስ;ዓርብ;ቅዳሜእሑድ;ሰኞ;ማክሰ;ረቡዕ;ሐሙስ;ዓርብ;ቅዳሜእ;ሰ;ማ;ረ;ሐ;ዓ;ቅالأحد;الاثنين;الثلاثاء;الأربعاء;الخميس;الجمعة;السبتح;ن;ث;ر;خ;ج;سdominche;luns;martz;miercres;chueves;viernes;sabadodom;lun;mar;mie;chu;vie;sabD;L;Ma;Mi;Ch;V;Sկիրակի;երկուշաբթի;երեքշաբթի;չորեքշաբթի;հինգշաբթի;ուրբաթ;շաբաթկիր;երկ;երք;չրք;հնգ;ուր;շբթԿ;Ե;Ե;Չ;Հ;Ո;Շদেওবাৰ;সোমবাৰ;মঙ্গলবাৰ;বুধবাৰ;বৃহস্পতিবাৰ;শুক্ৰবাৰ;শনিবাৰদেও;সোম;মঙ্গল;বুধ;বৃহ;শুক্ৰ;শনিদ;স;ম;ব;ব;শ;শdomingu;llunes;martes;miércoles;xueves;vienres;sábadudom;llu;mar;mié;xue;vie;sábD;L;M;M;X;V;SJumapili;Jumatatu;Jumanne;Jumatano;Alhamisi;Ijumaa;JumamosiJpi;Jtt;Jnn;Jtn;Alh;Ijm;JmoJ;J;J;J;A;I;JWai Yoka Bawai;Wai Tunga;Toki Gitung;Tsam Kasuwa;Wai Na Nas;Wai Na Tiyon;Wai Na ChirimYok;Tung;Gitung;Tsan;Nas;Nat;Chirbazar;bazar ertəsi;çərşənbə axşamı;çərşənbə;cümə axşamı;cümə;şənbəB.;B.E.;Ç.A.;Ç.;C.A.;C.;Ş.B.;B.e.;Ç.a.;Ç.;C.a.;C.;Ş.базар;базар ертәси;чәршәнбә ахшамы;чәршәнбә;ҹүмә ахшамы;ҹүмә;шәнбәБ.;Б.Е.;Ч.А.;Ч.;Ҹ.А.;Ҹ.;Ш.sɔ́ndǝ;lǝndí;maadí;mɛkrɛdí;jǝǝdí;júmbá;samdísɔ́n;lǝn;maa;mɛk;jǝǝ;júm;sams;l;m;m;j;j;skari;ntɛnɛ;tarata;araba;alamisa;juma;sibirikar;ntɛ;tar;ara;ala;jum;sibK;N;T;A;A;J;Sরবিবার;সোমবার;মঙ্গলবার;বুধবার;বৃহস্পতিবার;শুক্রবার;শনিবাররবি;সোম;মঙ্গল;বুধ;বৃহস্পতি;শুক্র;শনির;সো;ম;বু;বৃ;শু;শŋgwà nɔ̂y;ŋgwà njaŋgumba;ŋgwà ûm;ŋgwà ŋgê;ŋgwà mbɔk;ŋgwà kɔɔ;ŋgwà jônnɔy;nja;uum;ŋge;mbɔ;kɔɔ;jonn;n;u;ŋ;m;k;jigandea;astelehena;asteartea;a..." /* TRUNCATED STRING LITERAL */
             ,uVar2);
  if (*(QString **)(in_FS_OFFSET + 0x28) == local_8) {
    return *(QString **)(in_FS_OFFSET + 0x28);
  }
LAB_0030eaaf:
  __stack_chk_fail();
}

Assistant:

static QString rawWeekDayName(const QLocaleData *data, const int day,
                              QLocale::FormatType type)
{
    QLocaleData::DataRange range;
    switch (type) {
    case QLocale::LongFormat:
        range = data->longDayNames();
        break;
    case QLocale::ShortFormat:
        range = data->shortDayNames();
        break;
    case QLocale::NarrowFormat:
        range = data->narrowDayNames();
        break;
    default:
        return QString();
    }
    return range.getListEntry(days_data, day == 7 ? 0 : day);
}